

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::~TimestampTestInstance
          (TimestampTestInstance *this)

{
  ~TimestampTestInstance(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

TimestampTestInstance::~TimestampTestInstance(void)
{
	if(m_timestampValues)
	{
		delete[] m_timestampValues;
		m_timestampValues = NULL;
	}
}